

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O2

void __thiscall
density::
sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
::reentrant_put_transaction<void>::cancel(reentrant_put_transaction<void> *this)

{
  if (*(long *)(this + 0x10) == 0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/sp_heter_queue.h"
               ,0x98b);
  }
  detail::
  LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::cancel_put_impl((Allocation *)this);
  *(undefined8 *)(this + 0x10) = 0;
  return;
}

Assistant:

void cancel() noexcept
            {
                DENSITY_ASSERT(!empty());
                Base::cancel_put_impl(m_put);
                m_put.m_user_storage = nullptr;
            }